

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_request.c
# Opt level: O3

int tnt_request_set_ops(tnt_request *req,tnt_stream *s)

{
  tnt_request_t tVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  tVar1 = (req->hdr).type;
  if (tVar1 == TNT_OP_UPDATE) {
    lVar4 = 0x48;
    lVar5 = 0x40;
  }
  else {
    if (tVar1 != TNT_OP_UPSERT) {
      return -1;
    }
    lVar4 = 0x30;
    lVar5 = 0x28;
  }
  plVar2 = (long *)s->data;
  lVar3 = *plVar2;
  *(long *)((long)&(req->hdr).sync + lVar5) = lVar3;
  *(long *)((long)&(req->hdr).sync + lVar4) = lVar3 + plVar2[1];
  return 0;
}

Assistant:

int
tnt_request_set_ops(struct tnt_request *req, struct tnt_stream *s)
{
	if (req->hdr.type == TNT_OP_UPDATE) {
		req->tuple     = TNT_SBUF_DATA(s);
		req->tuple_end = req->tuple + TNT_SBUF_SIZE(s);
		return 0;
	} else if (req->hdr.type == TNT_OP_UPSERT) {
		req->key     = TNT_SBUF_DATA(s);
		req->key_end = req->key + TNT_SBUF_SIZE(s);
		return 0;
	}
	return -1;
}